

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapRule.c
# Opt level: O3

Vec_Int_t * Amap_CreateRulesVector_rec(Amap_Lib_t *p,Vec_Ptr_t *vVecNods,int fXor)

{
  ulong uVar1;
  void *pvVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  Vec_Int_t *vNods;
  int *piVar6;
  Vec_Ptr_t *vVecNods_00;
  void **ppvVar7;
  Vec_Ptr_t *vVecNods_01;
  ulong uVar8;
  Vec_Int_t *pVVar9;
  Vec_Int_t *pVVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  size_t sVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  int iVar21;
  ulong uVar22;
  bool bVar23;
  long local_68;
  
  uVar19 = vVecNods->nSize;
  uVar22 = (ulong)uVar19;
  if (uVar22 == 1) {
    pvVar2 = *vVecNods->pArray;
    vNods = (Vec_Int_t *)malloc(0x10);
    iVar5 = *(int *)((long)pvVar2 + 4);
    vNods->nSize = iVar5;
    vNods->nCap = iVar5;
    if ((long)iVar5 == 0) {
      sVar15 = 0;
      piVar6 = (int *)0x0;
    }
    else {
      sVar15 = (long)iVar5 << 2;
      piVar6 = (int *)malloc(sVar15);
    }
    vNods->pArray = piVar6;
    memcpy(piVar6,*(void **)((long)pvVar2 + 8),sVar15);
  }
  else {
    vNods = (Vec_Int_t *)malloc(0x10);
    vNods->nCap = 0x10;
    vNods->nSize = 0;
    piVar6 = (int *)malloc(0x40);
    vNods->pArray = piVar6;
    vVecNods_00 = (Vec_Ptr_t *)malloc(0x10);
    uVar12 = 8;
    if (6 < uVar19 - 1) {
      uVar12 = (ulong)uVar19;
    }
    iVar5 = (int)uVar12;
    vVecNods_00->nCap = iVar5;
    if (iVar5 == 0) {
      ppvVar7 = (void **)0x0;
    }
    else {
      ppvVar7 = (void **)malloc((long)iVar5 * 8);
    }
    vVecNods_00->pArray = ppvVar7;
    vVecNods_01 = (Vec_Ptr_t *)malloc(0x10);
    vVecNods_01->nCap = iVar5;
    if (iVar5 == 0) {
      ppvVar7 = (void **)0x0;
    }
    else {
      ppvVar7 = (void **)malloc((long)iVar5 << 3);
    }
    vVecNods_01->pArray = ppvVar7;
    uVar8 = uVar22;
    do {
      if ((int)uVar8 < 1) {
        if (1 < (int)uVar19) {
          uVar13 = (ulong)(uVar19 - 1);
          local_68 = uVar13 * 8;
          uVar8 = uVar12;
          do {
            iVar5 = (int)uVar22;
            uVar22 = (ulong)(iVar5 - 1);
            vVecNods_01->nSize = 0;
            uVar16 = 0;
            do {
              if ((long)vVecNods->nSize <= (long)uVar16) goto LAB_0044806c;
              pvVar2 = vVecNods->pArray[uVar16];
              if (uVar16 == uVar8) {
                ppvVar7 = vVecNods_00->pArray;
                if (uVar16 < 0x10) {
                  if (ppvVar7 == (void **)0x0) {
                    ppvVar7 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar7 = (void **)realloc(ppvVar7,0x80);
                  }
                  vVecNods_00->pArray = ppvVar7;
                  vVecNods_00->nCap = 0x10;
                  uVar8 = 0x10;
                }
                else {
                  if (ppvVar7 == (void **)0x0) {
                    ppvVar7 = (void **)malloc(uVar16 << 4);
                  }
                  else {
                    ppvVar7 = (void **)realloc(ppvVar7,uVar16 << 4);
                  }
                  vVecNods_00->pArray = ppvVar7;
                  uVar19 = (int)uVar16 * 2;
                  uVar8 = (ulong)uVar19;
                  vVecNods_00->nCap = uVar19;
                }
              }
              else {
                ppvVar7 = vVecNods_00->pArray;
              }
              uVar1 = uVar16 + 1;
              vVecNods_00->nSize = (int)uVar1;
              ppvVar7[uVar16] = pvVar2;
              uVar16 = uVar1;
            } while (uVar1 != uVar13);
            if (iVar5 <= vVecNods->nSize) {
              sVar15 = 0;
              uVar20 = 0;
              uVar16 = uVar12;
              uVar1 = 0;
              do {
                uVar12 = uVar1;
                pvVar2 = *(void **)((long)vVecNods->pArray + uVar20 * 8 + local_68);
                iVar21 = (int)uVar12;
                if (uVar20 == uVar16) {
                  ppvVar7 = vVecNods_01->pArray;
                  if (uVar20 < 0x10) {
                    if (ppvVar7 == (void **)0x0) {
                      ppvVar7 = (void **)malloc(0x80);
                    }
                    else {
                      ppvVar7 = (void **)realloc(ppvVar7,0x80);
                    }
                    vVecNods_01->pArray = ppvVar7;
                    uVar12 = 0x10;
                  }
                  else {
                    if (ppvVar7 == (void **)0x0) {
                      ppvVar7 = (void **)malloc(sVar15);
                    }
                    else {
                      ppvVar7 = (void **)realloc(ppvVar7,sVar15);
                    }
                    vVecNods_01->pArray = ppvVar7;
                  }
                }
                else {
                  ppvVar7 = vVecNods_01->pArray;
                  uVar12 = uVar16;
                }
                ppvVar7[uVar20] = pvVar2;
                uVar20 = uVar20 + 1;
                sVar15 = sVar15 + 0x10;
                uVar16 = uVar12;
                uVar1 = (ulong)(iVar21 + 2);
              } while ((int)uVar20 + (int)uVar13 < vVecNods->nSize);
              vVecNods_01->nSize = (int)uVar20;
              vVecNods_01->nCap = (int)uVar12;
            }
            pVVar9 = Amap_CreateRulesVector_rec(p,vVecNods_00,fXor);
            pVVar10 = Amap_CreateRulesVector_rec(p,vVecNods_01,fXor);
            Amap_CreateRulesTwo(p,vNods,pVVar9,pVVar10,fXor);
            if (pVVar9->pArray != (int *)0x0) {
              free(pVVar9->pArray);
            }
            free(pVVar9);
            if (pVVar10->pArray != (int *)0x0) {
              free(pVVar10->pArray);
            }
            free(pVVar10);
            uVar13 = uVar13 - 1;
            local_68 = local_68 + -8;
          } while (2 < iVar5);
        }
        goto LAB_0044801f;
      }
      lVar3 = uVar8 - 1;
    } while ((*(int *)((long)vVecNods->pArray[lVar3] + 4) == 1) &&
            (uVar8 = uVar8 - 1, **(int **)((long)vVecNods->pArray[lVar3] + 8) == 0));
    iVar5 = 1 << ((byte)uVar19 & 0x1f);
    if (3 < iVar5) {
      uVar22 = uVar12;
      uVar19 = 1;
      do {
        vVecNods_00->nSize = 0;
        vVecNods_01->nSize = 0;
        if ((long)vVecNods->nSize < 1) {
LAB_0044808b:
          __assert_fail("Vec_PtrSize(vVecNods0) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapRule.c"
                        ,0xa4,
                        "Vec_Int_t *Amap_CreateRulesVector_rec(Amap_Lib_t *, Vec_Ptr_t *, int)");
        }
        uVar17 = 0;
        uVar14 = 0;
        uVar8 = (long)vVecNods->nSize;
        do {
          if ((long)vVecNods->nSize < (long)uVar8) {
LAB_0044806c:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pvVar2 = vVecNods->pArray[uVar8 - 1];
          if ((uVar19 >> ((int)uVar8 - 1U & 0x1f) & 1) == 0) {
            uVar18 = (uint)uVar12;
            if (uVar14 == uVar18) {
              if ((int)uVar18 < 0x10) {
                if (vVecNods_00->pArray == (void **)0x0) {
                  ppvVar7 = (void **)malloc(0x80);
                }
                else {
                  ppvVar7 = (void **)realloc(vVecNods_00->pArray,0x80);
                }
                vVecNods_00->pArray = ppvVar7;
                vVecNods_00->nCap = 0x10;
                uVar12 = 0x10;
              }
              else {
                uVar12 = (ulong)(uVar18 * 2);
                if (vVecNods_00->pArray == (void **)0x0) {
                  ppvVar7 = (void **)malloc(uVar12 * 8);
                }
                else {
                  ppvVar7 = (void **)realloc(vVecNods_00->pArray,uVar12 * 8);
                }
                vVecNods_00->pArray = ppvVar7;
                vVecNods_00->nCap = uVar18 * 2;
              }
            }
            else {
              ppvVar7 = vVecNods_00->pArray;
            }
            vVecNods_00->nSize = uVar14 + 1;
            uVar18 = uVar17;
            uVar4 = uVar14 + 1;
            uVar11 = uVar14;
          }
          else {
            uVar18 = (uint)uVar22;
            if (uVar17 == uVar18) {
              if ((int)uVar18 < 0x10) {
                if (vVecNods_01->pArray == (void **)0x0) {
                  ppvVar7 = (void **)malloc(0x80);
                }
                else {
                  ppvVar7 = (void **)realloc(vVecNods_01->pArray,0x80);
                }
                vVecNods_01->pArray = ppvVar7;
                vVecNods_01->nCap = 0x10;
                uVar22 = 0x10;
              }
              else {
                uVar22 = (ulong)(uVar18 * 2);
                if (vVecNods_01->pArray == (void **)0x0) {
                  ppvVar7 = (void **)malloc(uVar22 * 8);
                }
                else {
                  ppvVar7 = (void **)realloc(vVecNods_01->pArray,uVar22 * 8);
                }
                vVecNods_01->pArray = ppvVar7;
                vVecNods_01->nCap = uVar18 * 2;
              }
            }
            else {
              ppvVar7 = vVecNods_01->pArray;
            }
            vVecNods_01->nSize = uVar17 + 1;
            uVar18 = uVar17 + 1;
            uVar4 = uVar14;
            uVar11 = uVar17;
          }
          uVar14 = uVar4;
          uVar17 = uVar18;
          ppvVar7[(int)uVar11] = pvVar2;
          bVar23 = 1 < uVar8;
          uVar8 = uVar8 - 1;
        } while (bVar23);
        if ((int)uVar14 < 1) goto LAB_0044808b;
        if ((int)uVar17 < 1) {
          __assert_fail("Vec_PtrSize(vVecNods1) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapRule.c"
                        ,0xa5,
                        "Vec_Int_t *Amap_CreateRulesVector_rec(Amap_Lib_t *, Vec_Ptr_t *, int)");
        }
        if (vVecNods->nSize <= (int)uVar14) {
          __assert_fail("Vec_PtrSize(vVecNods0) < Vec_PtrSize(vVecNods)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapRule.c"
                        ,0xa6,
                        "Vec_Int_t *Amap_CreateRulesVector_rec(Amap_Lib_t *, Vec_Ptr_t *, int)");
        }
        if ((uint)vVecNods->nSize <= uVar17) {
          __assert_fail("Vec_PtrSize(vVecNods1) < Vec_PtrSize(vVecNods)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapRule.c"
                        ,0xa7,
                        "Vec_Int_t *Amap_CreateRulesVector_rec(Amap_Lib_t *, Vec_Ptr_t *, int)");
        }
        pVVar9 = Amap_CreateRulesVector_rec(p,vVecNods_00,fXor);
        pVVar10 = Amap_CreateRulesVector_rec(p,vVecNods_01,fXor);
        Amap_CreateRulesTwo(p,vNods,pVVar9,pVVar10,fXor);
        if (pVVar9->pArray != (int *)0x0) {
          free(pVVar9->pArray);
        }
        free(pVVar9);
        if (pVVar10->pArray != (int *)0x0) {
          free(pVVar10->pArray);
        }
        free(pVVar10);
        bVar23 = uVar19 != iVar5 - 3U;
        uVar19 = uVar19 + 1;
      } while (bVar23);
    }
LAB_0044801f:
    if (vVecNods_00->pArray != (void **)0x0) {
      free(vVecNods_00->pArray);
    }
    free(vVecNods_00);
    if (vVecNods_01->pArray != (void **)0x0) {
      free(vVecNods_01->pArray);
    }
    free(vVecNods_01);
  }
  return vNods;
}

Assistant:

Vec_Int_t * Amap_CreateRulesVector_rec( Amap_Lib_t * p, Vec_Ptr_t * vVecNods, int fXor )
{
    Vec_Ptr_t * vVecNods0, * vVecNods1;
    Vec_Int_t * vRes, * vNods, * vNods0, * vNods1;
    int i, k;
    if ( Vec_PtrSize(vVecNods) == 1 )
        return Vec_IntDup( (Vec_Int_t *)Vec_PtrEntry(vVecNods, 0) );
    vRes = Vec_IntAlloc( 10 );
    vVecNods0 = Vec_PtrAlloc( Vec_PtrSize(vVecNods) );
    vVecNods1 = Vec_PtrAlloc( Vec_PtrSize(vVecNods) );
    if ( Amap_CreateCheckAllZero(vVecNods) )
    {
        for ( i = Vec_PtrSize(vVecNods)-1; i > 0; i-- )
        {
            Vec_PtrClear( vVecNods0 );
            Vec_PtrClear( vVecNods1 );
            Vec_PtrForEachEntryStop( Vec_Int_t *, vVecNods, vNods, k, i )
                Vec_PtrPush( vVecNods0, vNods );
            Vec_PtrForEachEntryStart( Vec_Int_t *, vVecNods, vNods, k, i )
                Vec_PtrPush( vVecNods1, vNods );
            vNods0 = Amap_CreateRulesVector_rec( p, vVecNods0, fXor );
            vNods1 = Amap_CreateRulesVector_rec( p, vVecNods1, fXor );
            Amap_CreateRulesTwo( p, vRes, vNods0, vNods1, fXor );
            Vec_IntFree( vNods0 );
            Vec_IntFree( vNods1 );
        }
    }
    else
    {
        int Limit = (1 << Vec_PtrSize(vVecNods))-2;
        for ( i = 1; i < Limit; i++ )
        {
            Vec_PtrClear( vVecNods0 );
            Vec_PtrClear( vVecNods1 );
            Vec_PtrForEachEntryReverse( Vec_Int_t *, vVecNods, vNods, k )
            {
                if ( i & (1 << k) )
                    Vec_PtrPush( vVecNods1, vNods );
                else
                    Vec_PtrPush( vVecNods0, vNods );
            }
            assert( Vec_PtrSize(vVecNods0) > 0 );
            assert( Vec_PtrSize(vVecNods1) > 0 );
            assert( Vec_PtrSize(vVecNods0) < Vec_PtrSize(vVecNods) );
            assert( Vec_PtrSize(vVecNods1) < Vec_PtrSize(vVecNods) );
            vNods0 = Amap_CreateRulesVector_rec( p, vVecNods0, fXor );
            vNods1 = Amap_CreateRulesVector_rec( p, vVecNods1, fXor );
            Amap_CreateRulesTwo( p, vRes, vNods0, vNods1, fXor );
            Vec_IntFree( vNods0 );
            Vec_IntFree( vNods1 );
        }
    }
    Vec_PtrFree( vVecNods0 );
    Vec_PtrFree( vVecNods1 );
    return vRes;
}